

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O0

void __thiscall testing::internal::String::String(String *this,char *a_c_str)

{
  String *in_RSI;
  char *in_RDI;
  String *this_00;
  
  if (in_RSI == (String *)0x0) {
    in_RDI[0] = '\0';
    in_RDI[1] = '\0';
    in_RDI[2] = '\0';
    in_RDI[3] = '\0';
    in_RDI[4] = '\0';
    in_RDI[5] = '\0';
    in_RDI[6] = '\0';
    in_RDI[7] = '\0';
    in_RDI[8] = '\0';
    in_RDI[9] = '\0';
    in_RDI[10] = '\0';
    in_RDI[0xb] = '\0';
    in_RDI[0xc] = '\0';
    in_RDI[0xd] = '\0';
    in_RDI[0xe] = '\0';
    in_RDI[0xf] = '\0';
  }
  else {
    this_00 = in_RSI;
    strlen((char *)in_RSI);
    ConstructNonNull(this_00,in_RDI,(size_t)in_RSI);
  }
  return;
}

Assistant:

String(const char* a_c_str) {  // NOLINT
    if (a_c_str == NULL) {
      c_str_ = NULL;
      length_ = 0;
    } else {
      ConstructNonNull(a_c_str, strlen(a_c_str));
    }
  }